

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGTexture.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmXe_LPGTextureCalc::SetPlanarOffsetInfo_2
          (GmmXe_LPGTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,
          GMM_RESCREATE_CUSTOM_PARAMS_2 *CreateParams)

{
  byte bVar1;
  GMM_PLATFORM_INFO *pGVar2;
  ulong uVar3;
  uint uVar4;
  
  pGVar2 = GmmGetPlatformInfo((this->super_GmmGen12TextureCalc).super_GmmGen11TextureCalc.
                              super_GmmGen10TextureCalc.super_GmmGen9TextureCalc.
                              super_GmmTextureCalc.pGmmLibContext);
  if (pGVar2->TileInfo[pTexInfo->TileMode].LogicalSize != 0) {
    (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.IsTileAlignedPlanes = true;
  }
  uVar4 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).NoOfPlanes;
  if (uVar4 != 0) {
    bVar1 = 1;
    do {
      uVar3 = (ulong)bVar1;
      *(ulong *)(pTexInfo->MmcHint + uVar3 * 8 + 0x78) =
           (ulong)(CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).PlaneOffset.X[uVar3];
      *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + uVar3 * 8 + 0x28) =
           (ulong)(CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).PlaneOffset.Y[uVar3];
      bVar1 = bVar1 + 1;
      uVar4 = (CreateParams->super_GMM_RESCREATE_CUSTOM_PARAMS).NoOfPlanes;
    } while (bVar1 <= uVar4);
  }
  (pTexInfo->OffsetInfo).field_0.PlaneXe_LPG.NoOfPlanes = uVar4;
  return;
}

Assistant:

void GmmLib::GmmXe_LPGTextureCalc::SetPlanarOffsetInfo_2(GMM_TEXTURE_INFO *pTexInfo, GMM_RESCREATE_CUSTOM_PARAMS_2 &CreateParams)
{
    const GMM_PLATFORM_INFO *pPlatform;
    pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]))
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.IsTileAlignedPlanes = true;
    }
    for(uint8_t i = 1; i <= CreateParams.NoOfPlanes; i++)
    {
        pTexInfo->OffsetInfo.PlaneXe_LPG.X[i] = CreateParams.PlaneOffset.X[i];
        pTexInfo->OffsetInfo.PlaneXe_LPG.Y[i] = CreateParams.PlaneOffset.Y[i];
    }
    pTexInfo->OffsetInfo.PlaneXe_LPG.NoOfPlanes = CreateParams.NoOfPlanes;
}